

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PianoWidget.cpp
# Opt level: O3

int __thiscall PianoWidget::getNoteFromMouse(PianoWidget *this,QPoint mousePos)

{
  int iVar1;
  undefined7 *puVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  
  iVar4 = mousePos.xp;
  iVar3 = (iVar4 / 6 + (iVar4 >> 0x1f) >> 1) - (iVar4 >> 0x1f);
  iVar1 = iVar3 % 7;
  if (mousePos.yp < 0x2a) {
    uVar5 = iVar4 + iVar3 * -0xc;
    if ((int)uVar5 < 5) {
      if ((iVar1 != 0) && (iVar3 = iVar1, iVar1 != 3)) {
LAB_0017c12f:
        iVar1 = *(int *)(PianoWidgetTU::BLACKKEY_LEFTOF + (long)iVar3 * 4);
        puVar2 = (undefined7 *)&PianoWidgetTU::BLACKKEY_TO_NOTE;
        goto LAB_0017c10e;
      }
    }
    else if (7 < uVar5) {
      iVar3 = 0;
      if (iVar1 != 6) {
        iVar3 = iVar1 + 1;
      }
      if ((iVar3 != 3) && (iVar3 != 0)) goto LAB_0017c12f;
    }
  }
  puVar2 = &PianoWidgetTU::WHITEKEY_TO_NOTE;
LAB_0017c10e:
  return (uint)*(byte *)((long)puVar2 + (long)iVar1) + (iVar4 / 0x54) * 0xc;
}

Assistant:

int PianoWidget::getNoteFromMouse(QPoint mousePos) {
    auto const x = mousePos.x();
    auto const y = mousePos.y();

    bool isBlack = false;
    int wkeyInOctave = x / TU::WKEY_WIDTH;
    int octave = wkeyInOctave / TU::N_WHITEKEYS;
    wkeyInOctave %= TU::N_WHITEKEYS;
    int bkeyInOctave = 0;

    if (y < TU::BKEY_HEIGHT) {
        // check if the mouse is over a black key
        bkeyInOctave = TU::BLACKKEY_LEFTOF[wkeyInOctave];
        int wkeyx = x % TU::WKEY_WIDTH;

        if (bkeyInOctave != TU::KEYINDEX_NULL && wkeyx <= TU::BKEY_WIDTH_HALF) {
            // mouse is over the black key to the left of the white key
            isBlack = true;
        } else {
            // now check the right
            
            // get the black key to the left of the next white key
            bkeyInOctave = TU::BLACKKEY_LEFTOF[wkeyInOctave == TU::N_WHITEKEYS - 1 ? 0 : wkeyInOctave + 1];
            
            if (bkeyInOctave != TU::KEYINDEX_NULL && wkeyx >= TU::WKEY_WIDTH - TU::BKEY_WIDTH_HALF) {
                isBlack = true;
            }
        }
    }

    int note = octave * 12;
    if (isBlack) {
        note += TU::BLACKKEY_TO_NOTE[bkeyInOctave];
    } else {
        note += TU::WHITEKEY_TO_NOTE[wkeyInOctave];
    }

    return note;
}